

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_cached_string.c
# Opt level: O0

HT_ErrorCode ht_feature_cached_string_enable(HT_Timeline *timeline,HT_Boolean thread_safe)

{
  HT_Feature *feature_00;
  HT_Feature *feature;
  HT_ErrorCode error_code;
  HT_Boolean thread_safe_local;
  HT_Timeline *timeline_local;
  
  feature._4_4_ = thread_safe;
  _error_code = timeline;
  feature_00 = ht_feature_cached_string_create(thread_safe,(HT_ErrorCode *)&feature);
  if (feature_00 == (HT_Feature *)0x0) {
    timeline_local._4_4_ = (HT_ErrorCode)feature;
  }
  else {
    timeline_local._4_4_ = ht_timeline_set_feature(_error_code,feature_00);
  }
  return timeline_local._4_4_;
}

Assistant:

HT_ErrorCode
ht_feature_cached_string_enable(HT_Timeline* timeline, HT_Boolean thread_safe)
{
    HT_ErrorCode error_code;
    HT_Feature* feature = ht_feature_cached_string_create(thread_safe, &error_code);

    if (!feature)
    {
        return error_code;
    }

    return ht_timeline_set_feature(timeline, feature);
}